

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall
QMdiSubWindowPrivate::setEnabled(QMdiSubWindowPrivate *this,WindowStateAction action,bool enable)

{
  bool bVar1;
  
  bVar1 = QPointer::operator_cast_to_bool((QPointer *)(this->actions + action));
  if (bVar1) {
    QAction::setEnabled(SUB81(this->actions[action].wp.value,0));
    return;
  }
  return;
}

Assistant:

void QMdiSubWindowPrivate::setEnabled(WindowStateAction action, bool enable)
{
    if (actions[action])
        actions[action]->setEnabled(enable);
}